

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TablePushBackgroundChannel(void)

{
  ImVec4 *pIVar1;
  ImGuiWindow *pIVar2;
  ImGuiTable *pIVar3;
  ImDrawList *pIVar4;
  ImVec2 IVar5;
  ImVec2 IVar6;
  ImVec2 IVar7;
  
  pIVar2 = GImGui->CurrentWindow;
  pIVar3 = GImGui->CurrentTable;
  IVar5 = (pIVar2->ClipRect).Max;
  (pIVar3->HostBackupInnerClipRect).Min = (pIVar2->ClipRect).Min;
  (pIVar3->HostBackupInnerClipRect).Max = IVar5;
  IVar5 = (pIVar3->Bg2ClipRectForDrawCmd).Max;
  IVar6 = (pIVar3->Bg2ClipRectForDrawCmd).Min;
  IVar7 = (pIVar3->Bg2ClipRectForDrawCmd).Max;
  (pIVar2->ClipRect).Min = (pIVar3->Bg2ClipRectForDrawCmd).Min;
  (pIVar2->ClipRect).Max = IVar5;
  pIVar4 = pIVar2->DrawList;
  (pIVar4->_CmdHeader).ClipRect.x = IVar6.x;
  (pIVar4->_CmdHeader).ClipRect.y = IVar6.y;
  (pIVar4->_CmdHeader).ClipRect.z = IVar7.x;
  (pIVar4->_CmdHeader).ClipRect.w = IVar7.y;
  pIVar1 = (pIVar2->DrawList->_ClipRectStack).Data +
           (long)(pIVar2->DrawList->_ClipRectStack).Size + -1;
  pIVar1->x = IVar6.x;
  pIVar1->y = IVar6.y;
  pIVar1->z = IVar7.x;
  pIVar1->w = IVar7.y;
  ImDrawListSplitter::SetCurrentChannel
            (&pIVar3->DrawSplitter,pIVar2->DrawList,(uint)pIVar3->Bg2DrawChannelCurrent);
  return;
}

Assistant:

void ImGui::TablePushBackgroundChannel()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiTable* table = g.CurrentTable;

    // Optimization: avoid SetCurrentChannel() + PushClipRect()
    table->HostBackupInnerClipRect = window->ClipRect;
    SetWindowClipRectBeforeSetChannel(window, table->Bg2ClipRectForDrawCmd);
    table->DrawSplitter.SetCurrentChannel(window->DrawList, table->Bg2DrawChannelCurrent);
}